

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitTableInit(PrintExpressionContents *this,TableInit *curr)

{
  ostream *stream;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"table.init ",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  Name::print(&curr->table,this->o);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
  Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitTableInit(TableInit* curr) {
    printMedium(o, "table.init ");
    curr->table.print(o);
    o << ' ';
    curr->segment.print(o);
  }